

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O3

hash_t duckdb::Hash<double>(double val)

{
  ulong uVar1;
  double dVar2;
  
  if (((val != 0.0) || (dVar2 = 0.0, NAN(val))) && (dVar2 = val, NAN(val))) {
    dVar2 = NAN;
  }
  uVar1 = ((ulong)dVar2 >> 0x20 ^ (ulong)dVar2) * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

hash_t Hash(double val) {
	static_assert(sizeof(double) == sizeof(uint64_t), "");
	FloatingPointEqualityTransform<double>::OP(val);
	uint64_t uval = Load<uint64_t>(const_data_ptr_cast(&val));
	return MurmurHash64(uval);
}